

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O0

void __thiscall Jzon::Node::add(Node *this,Node *node)

{
  Data *pDVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
  local_40;
  Node *local_18;
  Node *node_local;
  Node *this_local;
  
  local_18 = node;
  node_local = this;
  bVar2 = isArray(this);
  if (bVar2) {
    detach(this);
    pDVar1 = this->data;
    std::__cxx11::string::string((string *)&local_60);
    std::make_pair<std::__cxx11::string,Jzon::Node_const&>(&local_40,&local_60,local_18);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
    ::push_back(&pDVar1->children,&local_40);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>
    ::~pair(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void Node::add(const Node &node)
	{
		if (isArray())
		{
			detach();
			data->children.push_back(std::make_pair(std::string(), node));
		}
	}